

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDLLoader.cpp
# Opt level: O2

void __thiscall Assimp::MDLImporter::ValidateHeader_Quake1(MDLImporter *this,Header *pcHeader)

{
  int iVar1;
  Logger *pLVar2;
  DeadlyImportError *pDVar3;
  allocator local_39;
  string local_38;
  
  if (pcHeader->num_frames == 0) {
    pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_38,"[Quake 1 MDL] There are no frames in the file",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
    __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  if (pcHeader->num_verts != 0) {
    iVar1 = pcHeader->num_tris;
    if (iVar1 == 0) {
      pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string
                ((string *)&local_38,"[Quake 1 MDL] There are no triangles in the file",&local_39);
      DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
      __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (this->iGSFileVersion == 0) {
      if (0x400 < pcHeader->num_verts) {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"Quake 1 MDL model has more than AI_MDL_MAX_VERTS vertices");
        iVar1 = pcHeader->num_tris;
      }
      if (0x800 < iVar1) {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"Quake 1 MDL model has more than AI_MDL_MAX_TRIANGLES triangles");
      }
      if (0x100 < pcHeader->num_frames) {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"Quake 1 MDL model has more than AI_MDL_MAX_FRAMES frames");
      }
      if ((this->iGSFileVersion == 0) && (pcHeader->version != 6)) {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,
                     "Quake 1 MDL model has an unknown version: AI_MDL_VERSION (=6) is the expected file format version"
                    );
      }
      if ((pcHeader->num_skins != 0) && ((pcHeader->skinwidth == 0 || (pcHeader->skinheight == 0))))
      {
        pLVar2 = DefaultLogger::get();
        Logger::warn(pLVar2,"Skin width or height are 0");
        return;
      }
    }
    return;
  }
  pDVar3 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"[Quake 1 MDL] There are no vertices in the file",&local_39);
  DeadlyImportError::DeadlyImportError(pDVar3,&local_38);
  __cxa_throw(pDVar3,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MDLImporter::ValidateHeader_Quake1(const MDL::Header* pcHeader)
{
    // some values may not be NULL
    if (!pcHeader->num_frames)
        throw DeadlyImportError( "[Quake 1 MDL] There are no frames in the file");

    if (!pcHeader->num_verts)
        throw DeadlyImportError( "[Quake 1 MDL] There are no vertices in the file");

    if (!pcHeader->num_tris)
        throw DeadlyImportError( "[Quake 1 MDL] There are no triangles in the file");

    // check whether the maxima are exceeded ...however, this applies for Quake 1 MDLs only
    if (!this->iGSFileVersion)
    {
        if (pcHeader->num_verts > AI_MDL_MAX_VERTS)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_VERTS vertices");

        if (pcHeader->num_tris > AI_MDL_MAX_TRIANGLES)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_TRIANGLES triangles");

        if (pcHeader->num_frames > AI_MDL_MAX_FRAMES)
            ASSIMP_LOG_WARN("Quake 1 MDL model has more than AI_MDL_MAX_FRAMES frames");

        // (this does not apply for 3DGS MDLs)
        if (!this->iGSFileVersion && pcHeader->version != AI_MDL_VERSION)
            ASSIMP_LOG_WARN("Quake 1 MDL model has an unknown version: AI_MDL_VERSION (=6) is "
                "the expected file format version");
        if(pcHeader->num_skins && (!pcHeader->skinwidth || !pcHeader->skinheight))
            ASSIMP_LOG_WARN("Skin width or height are 0");
    }
}